

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O2

clause * solver2_propagate(sat_solver2 *s)

{
  ABC_INT64_T *pAVar1;
  char cVar2;
  clause cVar3;
  veci *pvVar4;
  char *pcVar5;
  clause cVar6;
  uint uVar7;
  clause *c;
  clause *pcVar8;
  int iVar9;
  cla from;
  clause cVar10;
  ulong uVar11;
  cla *pcVar12;
  ulong uVar13;
  cla *pcVar14;
  int iVar15;
  cla *pcVar16;
  int Lit;
  int local_64;
  ulong local_60;
  cla *local_58;
  Sat_Mem_t *local_50;
  clause *local_48;
  sat_solver2 *local_40;
  veci *local_38;
  
  local_50 = &s->Mem;
  local_48 = (clause *)0x0;
  local_40 = s;
  do {
    if (local_48 != (clause *)0x0) {
      return local_48;
    }
    iVar15 = s->qhead;
    if (s->qtail <= iVar15) {
      return (clause *)0x0;
    }
    pvVar4 = s->wlists;
    s->qhead = iVar15 + 1;
    uVar7 = s->trail[iVar15];
    local_38 = pvVar4 + (int)uVar7;
    pcVar12 = pvVar4[(int)uVar7].ptr;
    iVar15 = pvVar4[(int)uVar7].size;
    pAVar1 = &(s->stats).propagations;
    *pAVar1 = *pAVar1 + 1;
    pcVar16 = pcVar12 + iVar15;
    local_60 = (ulong)(uVar7 ^ 1);
    local_48 = (clause *)0x0;
    uVar13 = local_60;
    pcVar14 = pcVar12;
    local_58 = pcVar16;
    for (; pcVar12 < pcVar16; pcVar12 = pcVar12 + 1) {
      c = Sat_MemClauseHand(local_50,*pcVar12);
      uVar11 = local_60;
      cVar6 = c[1];
      cVar3 = c[2];
      cVar10 = SUB84(uVar13,0);
      if (cVar6 == cVar10) {
        c[1] = cVar3;
        c[2] = cVar10;
        cVar6 = cVar3;
      }
      else if (cVar3 != cVar10) {
        __assert_fail("lits[1] == false_lit",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                      ,0x3a2,"clause *solver2_propagate(sat_solver2 *)");
      }
      iVar15 = (int)cVar6 >> 1;
      pcVar5 = s->assigns;
      if (((uint)cVar6 & 1) == (int)pcVar5[iVar15]) {
        *pcVar14 = *pcVar12;
        pcVar14 = pcVar14 + 1;
        pcVar16 = local_58;
      }
      else {
        for (pcVar8 = c + 3; pcVar8 < c + (ulong)((uint)*c >> 0xb) + 1; pcVar8 = pcVar8 + 1) {
          cVar3 = *pcVar8;
          if (((uint)cVar3 & 1 ^ (int)pcVar5[(int)cVar3 >> 1]) != 1) {
            c[2] = cVar3;
            *pcVar8 = SUB84(local_60,0);
            veci_push(s->wlists + ((long)(int)c[2] ^ 1),*pcVar12);
            pcVar16 = local_58;
            goto LAB_004340ab;
          }
        }
        Lit = (int)cVar6;
        if ((s->fProofLogging != 0) && ((s->trail_lim).size == 0)) {
          cVar2 = pcVar5[iVar15];
          proof_chain_start(s,c);
          for (uVar13 = 1; (s = local_40, uVar13 < (uint)*c >> 0xb && (1 < (uint)c[uVar13 + 1]));
              uVar13 = uVar13 + 1) {
            iVar9 = (int)c[uVar13 + 1] >> 1;
            if (local_40->levels[iVar9] != 0) {
              __assert_fail("var_level(s, x) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                            ,0x3bb,"clause *solver2_propagate(sat_solver2 *)");
            }
            proof_chain_resolve(local_40,(clause *)0x0,iVar9);
          }
          iVar9 = proof_chain_stop(local_40);
          local_64 = clause2_create_new(s,&Lit,&local_64,1,iVar9);
          pcVar8 = var_unit_clause(s,iVar15);
          if ((((uint)cVar6 & 1 ^ (int)cVar2) != 1) != (pcVar8 == (clause *)0x0)) {
            __assert_fail("(var_unit_clause(s, Var) == NULL) != fLitIsFalse",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                          ,0x3c1,"clause *solver2_propagate(sat_solver2 *)");
          }
          pcVar8 = var_unit_clause(s,iVar15);
          if (pcVar8 == (clause *)0x0) {
            var_set_unit_clause(s,iVar15,local_64);
          }
          else {
            pcVar8 = Sat_MemClauseHand(local_50,local_64);
            proof_chain_start(s,pcVar8);
            proof_chain_resolve(s,(clause *)0x0,iVar15);
            iVar15 = proof_chain_stop(s);
            s->hProofLast = iVar15;
          }
        }
        from = *pcVar12;
        *pcVar14 = from;
        cVar6 = *c;
        if (((uint)cVar6 & 1) != 0) {
          uVar7 = sat_clause_compute_lbd(s,c);
          *c = (clause)(((uint)cVar6 & 0xfffff807) + (uVar7 & 0xff) * 8);
          from = *pcVar12;
        }
        pcVar14 = pcVar14 + 1;
        iVar15 = solver2_enqueue(s,Lit,from);
        pcVar16 = local_58;
        uVar11 = local_60;
        if (iVar15 == 0) {
          local_48 = Sat_MemClauseHand(local_50,*pcVar12);
          while (pcVar12 = pcVar12 + 1, uVar11 = local_60, pcVar12 < pcVar16) {
            *pcVar14 = *pcVar12;
            pcVar14 = pcVar14 + 1;
          }
        }
      }
LAB_004340ab:
      uVar13 = uVar11;
    }
    uVar13 = (long)pcVar14 - (long)local_38->ptr;
    pAVar1 = &(s->stats).inspects;
    *pAVar1 = *pAVar1 + ((long)uVar13 >> 2);
    veci_resize(local_38,(int)(uVar13 >> 2));
  } while( true );
}

Assistant:

clause* solver2_propagate(sat_solver2* s)
{
    clause* c, * confl  = NULL;
    veci* ws;
    lit* lits, false_lit, p, * stop, * k;
    cla* begin,* end, *i, *j;
    int Lit;

    while (confl == 0 && s->qtail - s->qhead > 0){

        p  = s->trail[s->qhead++];
        ws = solver2_wlist(s,p);
        begin = (cla*)veci_begin(ws);
        end   = begin + veci_size(ws);

        s->stats.propagations++;
        for (i = j = begin; i < end; ){
            c = clause2_read(s,*i);
            lits = c->lits;

            // Make sure the false literal is data[1]:
            false_lit = lit_neg(p);
            if (lits[0] == false_lit){
                lits[0] = lits[1];
                lits[1] = false_lit;
            }
            assert(lits[1] == false_lit);

            // If 0th watch is true, then clause is already satisfied.
            if (var_value(s, lit_var(lits[0])) == lit_sign(lits[0]))
                *j++ = *i;
            else{
                // Look for new watch:
                stop = lits + c->size;
                for (k = lits + 2; k < stop; k++){
                    if (var_value(s, lit_var(*k)) != !lit_sign(*k)){
                        lits[1] = *k;
                        *k = false_lit;
                        veci_push(solver2_wlist(s,lit_neg(lits[1])),*i);
                        goto WatchFound; }
                }

                // Did not find watch -- clause is unit under assignment:
                Lit = lits[0];
                if ( s->fProofLogging && solver2_dlevel(s) == 0 )
                {
                    int k, x, proof_id, Cid, Var = lit_var(Lit);
                    int fLitIsFalse = (var_value(s, Var) == !lit_sign(Lit));
                    // Log production of top-level unit clause:
                    proof_chain_start( s, c );
                    clause_foreach_var( c, x, k, 1 ){
                        assert( var_level(s, x) == 0 );
                        proof_chain_resolve( s, NULL, x );
                    }
                    proof_id = proof_chain_stop( s );
                    // get a new clause
                    Cid = clause2_create_new( s, &Lit, &Lit + 1, 1, proof_id );
                    assert( (var_unit_clause(s, Var) == NULL) != fLitIsFalse );
                    // if variable already has unit clause, it must be with the other polarity 
                    // in this case, we should derive the empty clause here
                    if ( var_unit_clause(s, Var) == NULL )
                        var_set_unit_clause(s, Var, Cid);
                    else{
                        // Empty clause derived:
                        proof_chain_start( s, clause2_read(s,Cid) );
                        proof_chain_resolve( s, NULL, Var );
                        proof_id = proof_chain_stop( s );
                        s->hProofLast = proof_id;
//                        clause2_create_new( s, &Lit, &Lit, 1, proof_id );
                    }
                }

                *j++ = *i;
                // Clause is unit under assignment:
                if ( c->lrn )
                    c->lbd = sat_clause_compute_lbd(s, c);
                if (!solver2_enqueue(s,Lit, *i)){
                    confl = clause2_read(s,*i++);
                    // Copy the remaining watches:
                    while (i < end)
                        *j++ = *i++;
                }
            }
WatchFound: i++;
        }
        s->stats.inspects += j - (int*)veci_begin(ws);
        veci_resize(ws,j - (int*)veci_begin(ws));
    }

    return confl;
}